

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree * __thiscall
absl::cord_internal::CordRepBtree::AddData<(absl::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,CordRepBtree *tree,string_view data,size_t extra)

{
  int iVar1;
  bool bVar2;
  OpResult OVar3;
  undefined1 auVar4 [12];
  CordRepBtree *pCVar5;
  CordRepBtree *pCVar6;
  Action AVar7;
  CordRepBtree **ppCVar8;
  ulong uVar9;
  uint uVar10;
  size_t delta;
  uint depth;
  string_view data_00;
  OpResult result;
  OpResult result_00;
  OpResult result_01;
  OpResult OVar11;
  string_view sVar12;
  basic_string_view<char,_std::char_traits<char>_> bVar13;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> ops;
  
  sVar12._M_str = (char *)data._M_len;
  if (tree == (CordRepBtree *)0x0) {
    return this;
  }
  depth = (uint)(this->super_CordRep).storage[0];
  pCVar5 = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
           BuildStack(&ops,this,depth);
  if ((ulong)(pCVar5->super_CordRep).storage[2] - (ulong)(pCVar5->super_CordRep).storage[1] < 6) {
    OVar11 = ToOpResult(pCVar5,(int)depth < ops.share_depth);
    pCVar6 = OVar11.tree;
    sVar12._M_len = (size_t)tree;
    sVar12 = AddData<(absl::cord_internal::CordRepBtree::EdgeType)1>
                       (pCVar6,sVar12,(size_t)data._M_str);
    pCVar5 = (CordRepBtree *)sVar12._M_len;
    if (pCVar5 == (CordRepBtree *)0x0) {
      (pCVar6->super_CordRep).length =
           (size_t)((tree->super_CordRep).storage + ((pCVar6->super_CordRep).length - 0xd));
      uVar9 = (ulong)OVar11.action;
      goto LAB_001331bc;
    }
    delta = (long)tree - (long)pCVar5;
    if (delta == 0) {
      __assert_fail("delta > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x279,
                    "static CordRepBtree *absl::cord_internal::CordRepBtree::AddData(CordRepBtree *, absl::string_view, size_t) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                   );
    }
    (pCVar6->super_CordRep).length = (pCVar6->super_CordRep).length + delta;
    auVar4 = OVar11._0_12_;
    OVar3._12_4_ = 0;
    OVar3.tree = (CordRepBtree *)auVar4._0_8_;
    OVar3.action = auVar4._8_4_;
    OVar11._12_4_ = 0;
    OVar11.tree = (CordRepBtree *)auVar4._0_8_;
    OVar11.action = auVar4._8_4_;
    if (depth != 0) {
      ppCVar8 = ops.stack + ((ulong)(depth - 1) - 1);
      uVar9 = (ulong)depth;
      OVar11 = OVar3;
      do {
        pCVar6 = ops.stack[uVar9 - 1];
        AVar7 = OVar11.action;
        if (AVar7 == kCopied) {
          OVar11 = SetEdge<(absl::cord_internal::CordRepBtree::EdgeType)1>
                             (pCVar6,(long)uVar9 <= (long)ops.share_depth,
                              &(OVar11.tree)->super_CordRep,delta);
          ops.stack[uVar9 - 1] = OVar11.tree;
        }
        else {
          if (AVar7 == kSelf) goto LAB_001330e1;
          if (AVar7 == kPopped) {
            __assert_fail("!propagate",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x145,
                          "CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::Unwind(CordRepBtree *, int, size_t, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack, propagate = true]"
                         );
          }
        }
        ppCVar8 = ppCVar8 + 0xffffffffffffffff;
        bVar2 = 1 < uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar2);
    }
    result.tree = OVar11._8_8_;
    result._8_8_ = OVar11.tree;
    pCVar6 = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
             Finalize((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1> *)this,
                      result._8_8_,result);
    goto LAB_001330ea;
  }
LAB_00133188:
  while( true ) {
    data_00._M_str = sVar12._M_str;
    data_00._M_len = (size_t)tree;
    pCVar6 = NewLeaf<(absl::cord_internal::CordRepBtree::EdgeType)1>(data_00,(size_t)data._M_str);
    pCVar5 = (CordRepBtree *)(pCVar6->super_CordRep).length;
    if (pCVar5 == tree) break;
    local_a8._M_len = (size_t)tree;
    local_a8._M_str = sVar12._M_str;
    bVar13 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_a8,(size_type)pCVar5,0xffffffffffffffff);
    sVar12._M_str = bVar13._M_str;
    tree = (CordRepBtree *)bVar13._M_len;
    result_00._8_8_ = 2;
    result_00.tree = pCVar6;
    this = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
           Unwind<false>(&ops,this,depth,(pCVar6->super_CordRep).length,result_00);
    depth = (uint)(this->super_CordRep).storage[0];
    if (0xb < depth) {
      __assert_fail("height <= CordRepBtree::kMaxHeight",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x103,
                    "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                   );
    }
    pCVar5 = this;
    for (uVar9 = 0; iVar1 = (pCVar5->super_CordRep).refcount.count_.super___atomic_base<int>._M_i,
        depth != uVar9; uVar9 = uVar9 + 1) {
      if (iVar1 != 2) {
        __assert_fail("tree->refcount.IsOne()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x106,
                      "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                     );
      }
      ops.stack[uVar9] = pCVar5;
      pCVar5 = CordRep::btree(*(CordRep **)
                               ((pCVar5->super_CordRep).storage +
                               (ulong)(pCVar5->super_CordRep).storage[2] * 8 + -5));
    }
    if (iVar1 != 2) {
      __assert_fail("tree->refcount.IsOne()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x10a,
                    "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                   );
    }
    ops.share_depth = depth + 1;
  }
  uVar9 = 2;
LAB_001331bc:
  result_01._8_8_ = uVar9;
  result_01.tree = pCVar6;
  pCVar5 = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)1>::
           Unwind<false>(&ops,this,depth,(size_t)tree,result_01);
  return pCVar5;
LAB_001330e1:
  while( true ) {
    uVar10 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar10;
    (pCVar6->super_CordRep).length = (pCVar6->super_CordRep).length + delta;
    if ((int)uVar10 < 1) break;
    pCVar6 = *ppCVar8;
    ppCVar8 = ppCVar8 + 0xffffffffffffffff;
  }
LAB_001330ea:
  ops.share_depth = depth + 1;
  tree = pCVar5;
  this = pCVar6;
  goto LAB_00133188;
}

Assistant:

CordRepBtree* CordRepBtree::AddData(CordRepBtree* tree, absl::string_view data,
                                    size_t extra) {
  if (ABSL_PREDICT_FALSE(data.empty())) return tree;

  const size_t original_data_size = data.size();
  int depth = tree->height();
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);

  // If there is capacity in the last edge, append as much data
  // as possible into this last edge.
  if (leaf->size() < leaf->capacity()) {
    OpResult result = leaf->ToOpResult(ops.owned(depth));
    data = result.tree->AddData<edge_type>(data, extra);
    if (data.empty()) {
      result.tree->length += original_data_size;
      return ops.Unwind(tree, depth, original_data_size, result);
    }

    // We added some data into this leaf, but not all. Propagate the added
    // length to the top most node, and rebuild the stack with any newly copied
    // or updated nodes. From this point on, the path (leg) from the top most
    // node to the right-most node towards the leaf node is privately owned.
    size_t delta = original_data_size - data.size();
    assert(delta > 0);
    result.tree->length += delta;
    tree = ops.Propagate(tree, depth, delta, result);
    ops.share_depth = depth + 1;
  }

  // We were unable to append all data into the existing right-most leaf node.
  // This means all remaining data must be put into (a) new leaf node(s) which
  // we append to the tree. To make this efficient, we iteratively build full
  // leaf nodes from `data` until the created leaf contains all remaining data.
  // We utilize the `Unwind` method to merge the created leaf into the first
  // level towards root that has capacity. On each iteration with remaining
  // data, we rebuild the stack in the knowledge that right-most nodes are
  // privately owned after the first `Unwind` completes.
  for (;;) {
    OpResult result = {CordRepBtree::NewLeaf<edge_type>(data, extra), kPopped};
    if (result.tree->length == data.size()) {
      return ops.Unwind(tree, depth, result.tree->length, result);
    }
    data = Consume<edge_type>(data, result.tree->length);
    tree = ops.Unwind(tree, depth, result.tree->length, result);
    depth = tree->height();
    ops.BuildOwnedStack(tree, depth);
  }
}